

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O2

Cardinality __thiscall testing::Between(testing *this,int min,int max)

{
  int iVar1;
  CardinalityInterface *__p;
  ostream *poVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Cardinality CVar3;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  __p = (CardinalityInterface *)operator_new(0x10);
  __p->_vptr_CardinalityInterface = (_func_int **)&PTR__CardinalityInterface_001cb550;
  iVar1 = 0;
  if (0 < min) {
    iVar1 = min;
  }
  *(int *)&__p[1]._vptr_CardinalityInterface = iVar1;
  if (iVar1 <= max) {
    iVar1 = max;
  }
  *(int *)((long)&__p[1]._vptr_CardinalityInterface + 4) = iVar1;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (min < 0) {
    poVar2 = std::operator<<(local_198,"The invocation lower bound must be >= 0, ");
    poVar2 = std::operator<<(poVar2,"but is actually ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,min);
    std::operator<<(poVar2,".");
    std::__cxx11::stringbuf::str();
    iVar1 = 0x3a;
  }
  else if (max < 0) {
    poVar2 = std::operator<<(local_198,"The invocation upper bound must be >= 0, ");
    poVar2 = std::operator<<(poVar2,"but is actually ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,max);
    std::operator<<(poVar2,".");
    std::__cxx11::stringbuf::str();
    iVar1 = 0x3e;
  }
  else {
    if ((uint)min <= (uint)max) goto LAB_001711ed;
    poVar2 = std::operator<<(local_198,"The invocation upper bound (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,max);
    poVar2 = std::operator<<(poVar2,") must be >= the invocation lower bound (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,min);
    std::operator<<(poVar2,").");
    std::__cxx11::stringbuf::str();
    iVar1 = 0x43;
  }
  internal::Expect(false,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googlemock/src/gmock-cardinalities.cc"
                   ,iVar1,&sStack_1c8);
  std::__cxx11::string::_M_dispose();
LAB_001711ed:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__shared_ptr<testing::CardinalityInterface_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<testing::CardinalityInterface_const,void>
            ((__shared_ptr<testing::CardinalityInterface_const,(__gnu_cxx::_Lock_policy)2> *)this,
             __p);
  CVar3.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  CVar3.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Cardinality)
         CVar3.impl_.
         super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}